

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

JSValue js_promise_executor(JSContext *ctx,JSValue this_val,int argc,JSValue *argv,int magic,
                           JSValue *func_data)

{
  int *piVar1;
  int64_t iVar2;
  undefined1 auVar3 [16];
  bool bVar4;
  bool bVar5;
  long lVar6;
  ulong uVar7;
  
  lVar6 = 0;
  bVar4 = true;
  do {
    bVar5 = bVar4;
    if ((int)func_data[lVar6].tag != 3) {
      JS_ThrowTypeError(ctx,"resolving function already set");
      uVar7 = 6;
      goto LAB_00145b75;
    }
    piVar1 = (int *)argv[lVar6].u.ptr;
    iVar2 = argv[lVar6].tag;
    if (0xfffffff4 < (uint)iVar2) {
      *piVar1 = *piVar1 + 1;
    }
    func_data[lVar6].u.ptr = piVar1;
    func_data[lVar6].tag = iVar2;
    lVar6 = 1;
    bVar4 = false;
  } while (bVar5);
  uVar7 = 3;
LAB_00145b75:
  auVar3._8_8_ = 0;
  auVar3._0_8_ = uVar7;
  return (JSValue)(auVar3 << 0x40);
}

Assistant:

static JSValue js_promise_executor(JSContext *ctx,
                                   JSValueConst this_val,
                                   int argc, JSValueConst *argv,
                                   int magic, JSValue *func_data)
{
    int i;

    for(i = 0; i < 2; i++) {
        if (!JS_IsUndefined(func_data[i]))
            return JS_ThrowTypeError(ctx, "resolving function already set");
        func_data[i] = JS_DupValue(ctx, argv[i]);
    }
    return JS_UNDEFINED;
}